

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O2

void improve_attack_modifier
               (player *p,object *obj,monster_conflict *mon,int *brand_used,int *slay_used,
               char *verb,_Bool range)

{
  slay_conflict *psVar1;
  _Bool _Var2;
  wchar_t wVar3;
  brand_conflict *pbVar4;
  long lVar5;
  ulong uVar6;
  wchar_t local_64;
  
  if ((long)*brand_used == 0) {
    if ((long)*slay_used != 0) {
      local_64 = L'\x01';
      if (L'\x01' < slays[*slay_used].multiplier) {
        local_64 = slays[*slay_used].multiplier;
      }
      goto LAB_001a291f;
    }
  }
  else {
    pbVar4 = brands + *brand_used;
    wVar3 = get_monster_brand_multiplier(mon,pbVar4);
    if (L'\x01' < wVar3) {
      local_64 = get_monster_brand_multiplier(mon,pbVar4);
      goto LAB_001a291f;
    }
  }
  local_64 = L'\x01';
LAB_001a291f:
  lVar5 = 0x30;
  for (uVar6 = 1; pbVar4 = brands, uVar6 < z_info->brand_max; uVar6 = uVar6 + 1) {
    if (obj == (object *)0x0) {
      _Var2 = player_has_temporary_brand(p,(wchar_t)uVar6);
      if (_Var2) goto LAB_001a2977;
    }
    else if ((obj->brands != (_Bool *)0x0) && (obj->brands[uVar6] != false)) {
LAB_001a2977:
      _Var2 = flag_has_dbg(mon->race->flags,0xc,*(int *)((long)&pbVar4->resist_flag + lVar5),
                           "mon->race->flags","b->resist_flag");
      if ((!_Var2) &&
         (wVar3 = get_monster_brand_multiplier(mon,(brand_conflict *)((long)&pbVar4->code + lVar5)),
         local_64 < wVar3)) {
        *brand_used = (wchar_t)uVar6;
        my_strcpy(verb,*(char **)((long)&pbVar4->verb + lVar5),0x14);
        local_64 = wVar3;
        if (range) {
          my_strcat(verb,"s",0x14);
        }
      }
    }
    lVar5 = lVar5 + 0x30;
  }
  uVar6 = 1;
  lVar5 = 0;
  do {
    psVar1 = slays;
    if (z_info->slay_max <= uVar6) {
      return;
    }
    if (obj == (object *)0x0) {
      _Var2 = player_has_temporary_slay(p,(wchar_t)uVar6);
      if (_Var2) goto LAB_001a2a56;
    }
    else if ((obj->slays != (_Bool *)0x0) && (obj->slays[uVar6] != false)) {
LAB_001a2a56:
      _Var2 = react_to_specific_slay((slay_conflict *)((long)&psVar1[1].code + lVar5),mon);
      if ((_Var2) && (wVar3 = *(wchar_t *)((long)&psVar1[1].multiplier + lVar5), local_64 < wVar3))
      {
        *brand_used = 0;
        *slay_used = (wchar_t)uVar6;
        my_strcpy(verb,*(char **)((long)&psVar1[1].melee_verb + lVar5 + (ulong)range * 8),0x14);
        local_64 = wVar3;
      }
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x38;
  } while( true );
}

Assistant:

void improve_attack_modifier(struct player *p, struct object *obj,
	const struct monster *mon, int *brand_used, int *slay_used,
	char *verb, bool range)
{
	int i, best_mult = 1;

	/* Set the current best multiplier */
	if (*brand_used) {
		struct brand *b = &brands[*brand_used];
		best_mult = MAX(best_mult,
			get_monster_brand_multiplier(mon, b));
	} else if (*slay_used) {
		struct slay *s = &slays[*slay_used];
		best_mult = MAX(best_mult, s->multiplier);
	}

	/* Brands */
	for (i = 1; i < z_info->brand_max; i++) {
		struct brand *b = &brands[i];
		if (obj) {
			/* Brand is on an object */
			if (!obj->brands || !obj->brands[i]) continue;
		} else {
			/* Temporary brand */
			if (!player_has_temporary_brand(p, i)) continue;
		}
 
		/* Is the monster vulnerable? */
		if (!rf_has(mon->race->flags, b->resist_flag)) {
			int mult = get_monster_brand_multiplier(mon, b);

			/* Record the best multiplier */
			if (best_mult < mult) {
				best_mult = mult;
				*brand_used = i;
				my_strcpy(verb, b->verb, 20);
				if (range)
					my_strcat(verb, "s", 20);
			}
		}
	}

	/* Slays */
	for (i = 1; i < z_info->slay_max; i++) {
		struct slay *s = &slays[i];
		if (obj) {
			/* Slay is on an object */
			if (!obj->slays || !obj->slays[i]) continue;
		} else {
			/* Temporary slay */
			if (!player_has_temporary_slay(p, i)) continue;
		}
 
		/* Is the monster is vulnerable? */
		if (react_to_specific_slay(s, mon)) {
			int mult = s->multiplier;

			/* Record the best multiplier */
			if (best_mult < mult) {
				best_mult = mult;
				*brand_used = 0;
				*slay_used = i;
				if (range) {
					my_strcpy(verb, s->range_verb, 20);
				} else {
					my_strcpy(verb, s->melee_verb, 20);
				}
			}
		}
	}
}